

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O3

void __thiscall Simulator::arg_integer(Simulator *this,PCode *code)

{
  pointer pcVar1;
  int iVar2;
  simulator_error *this_00;
  _Elt_pointer pSVar3;
  StackSymbol back;
  int local_104;
  double local_100;
  Symbol local_f8;
  Type local_70;
  int local_68;
  vector<int,_std::allocator<int>_> local_60;
  double local_48;
  vector<double,_std::allocator<double>_> local_40;
  
  pSVar3 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar3 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar3 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  local_70 = pSVar3[-1].type_;
  local_68 = pSVar3[-1].value_.int_value;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,&pSVar3[-1].value_.int_array);
  local_48 = pSVar3[-1].value_.real_value;
  std::vector<double,_std::allocator<double>_>::vector(&local_40,&pSVar3[-1].value_.real_array);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  iVar2 = local_68;
  if (local_70 == kReal) {
    local_100 = local_48;
    local_f8.name_._M_dataplus._M_p = (pointer)&local_f8.name_.field_2;
    pcVar1 = (code->first_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar1,pcVar1 + (code->first_)._M_string_length);
    local_f8.value_.int_value = (int)local_100;
    local_f8.type_ = kInt;
    local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8._36_8_ = 0;
    local_f8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    local_f8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    local_f8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    local_f8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.is_assigned_ = true;
    ScopeTree::define(&this->tree_,&local_f8);
  }
  else {
    if (local_70 != kInt) {
      this_00 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_104 = this->eip_;
      local_f8.name_._M_dataplus._M_p = (pointer)&local_f8.name_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,anon_var_dwarf_aeca,anon_var_dwarf_aeca + 0x24);
      simulator_error::simulator_error(this_00,&local_104,&local_f8.name_);
      __cxa_throw(this_00,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    local_f8.name_._M_dataplus._M_p = (pointer)&local_f8.name_.field_2;
    pcVar1 = (code->first_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar1,pcVar1 + (code->first_)._M_string_length);
    local_f8.type_ = kInt;
    local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8._36_8_ = 0;
    local_f8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    local_f8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    local_f8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    local_f8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.is_assigned_ = true;
    local_f8.value_.int_value = iVar2;
    ScopeTree::define(&this->tree_,&local_f8);
  }
  if (local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<Symbol,_std::allocator<Symbol>_>::~vector(&local_f8.value_.args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.name_._M_dataplus._M_p != &local_f8.name_.field_2) {
    operator_delete(local_f8.name_._M_dataplus._M_p);
  }
  this->eip_ = this->eip_ + 1;
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Simulator::arg_integer(const PCode &code) {
    StackSymbol back = stack_.back();
    stack_.pop_back();

    if (back.type() == StackSymbol::Type::kInt) {
        tree_.define(Symbol(code.first(), (int)back.int_value(), true));
    } else if (back.type() == StackSymbol::Type::kReal) {
        tree_.define(Symbol(code.first(), (int)back.real_value(), true));
    } else {
        throw simulator_error(eip(), "不支持的函数调用实参类型");
    }

    inc_eip();
}